

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O1

bool __thiscall NaPNDelay::activate(NaPNDelay *this)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  bVar7 = true;
  if (this->nActiveSleep == 0) {
    uVar2 = NaPetriNode::activations(&this->super_NaPetriNode);
    bVar7 = this->nMaxLag <= uVar2;
  }
  this->bAwaken = bVar7;
  if (bVar7 != false) {
    iVar3 = (*(this->super_NaPetriNode)._vptr_NaPetriNode[3])(this);
    if ((char)iVar3 != '\0') {
      pcVar4 = NaPetriNode::name(&this->super_NaPetriNode);
      uVar2 = NaPetriNode::activations(&this->super_NaPetriNode);
      NaPrintLog("node \'%s\' is awaken: activations=%d, delay=",pcVar4,(ulong)uVar2);
      uVar5 = (ulong)(uint)this->nOutDim;
      if (this->nOutDim != 0) {
        uVar6 = 0;
        do {
          uVar1 = uVar6 + 1;
          pcVar4 = "%d,";
          if (uVar1 == uVar5) {
            pcVar4 = "%d\n";
          }
          NaPrintLog(pcVar4,(ulong)this->piOutMap[uVar6]);
          uVar5 = (ulong)(uint)this->nOutDim;
          uVar6 = uVar1;
        } while (uVar1 < uVar5);
      }
    }
  }
  bVar7 = NaPetriCnInput::is_waiting(&this->in);
  if (bVar7) {
    bVar7 = false;
  }
  else {
    bVar7 = true;
    if (this->bAwaken == true) {
      bVar7 = NaPetriCnOutput::is_waiting(&this->dout);
      bVar7 = !bVar7;
    }
  }
  return bVar7;
}

Assistant:

bool
NaPNDelay::activate ()
{
  // For action() and post_action() only
  bAwaken = awake();

  if(bAwaken && is_verbose())
    {
      unsigned	i;
      NaPrintLog("node '%s' is awaken: activations=%d, delay=",
		 name(), activations());
      for(i = 0; i < nOutDim; ++i)
	if(i + 1 == nOutDim)
	  NaPrintLog("%d\n", piOutMap[i]);
	else
	  NaPrintLog("%d,", piOutMap[i]);
    }

  // Does not depend on bAwaken state and output state, so 
  return !in.is_waiting() &&
    (!bAwaken || (bAwaken && !dout.is_waiting()));
}